

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::erase(map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
        *this,Node *x)

{
  color_type cVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  color_type cVar5;
  Node *pNVar6;
  
  cVar5 = x->color;
  pNVar6 = x->left;
  pNVar2 = this->nil;
  pNVar4 = x->right;
  if (pNVar6 == pNVar2) {
    pNVar3 = x->parent;
    (&pNVar3->left)[pNVar3->left != x] = pNVar4;
    pNVar6 = pNVar4;
  }
  else if (pNVar4 == pNVar2) {
    pNVar3 = x->parent;
    (&pNVar3->left)[pNVar3->left != x] = pNVar6;
    pNVar4 = pNVar6;
  }
  else {
    do {
      pNVar3 = pNVar4;
      pNVar4 = pNVar3->left;
    } while (pNVar3->left != pNVar2);
    cVar1 = pNVar3->color;
    pNVar6 = pNVar3->right;
    pNVar2 = pNVar3->parent;
    pNVar4 = pNVar6;
    if (pNVar2 != x) {
      (&pNVar2->left)[pNVar2->left != pNVar3] = pNVar6;
      pNVar6->parent = pNVar2;
      pNVar4 = x->right;
      pNVar3->right = pNVar4;
    }
    pNVar4->parent = pNVar3;
    pNVar2 = x->parent;
    (&pNVar2->left)[pNVar2->left != x] = pNVar3;
    pNVar3->parent = pNVar2;
    pNVar3->color = cVar5;
    pNVar4 = x->left;
    pNVar3->left = pNVar4;
    cVar5 = cVar1;
  }
  pNVar4->parent = pNVar3;
  operator_delete(x->value,0x10);
  operator_delete(x,0x28);
  this->tot = this->tot - 1;
  if (cVar5 == BLACK) {
    erase_fixup(this,pNVar6);
    pNVar2 = this->nil;
    pNVar2->parent = pNVar2;
    pNVar4 = pNVar2;
  }
  else {
    pNVar2 = this->nil;
    pNVar4 = pNVar2;
  }
  do {
    pNVar6 = pNVar4;
    pNVar4 = pNVar6->left;
  } while (pNVar4 != pNVar2);
  this->nodebegin = pNVar6;
  return;
}

Assistant:

void erase(Node *x)
	{
		color_type col = x -> color;Node *y;
		if (x -> left == nil) y = x -> right , transplant(x , x -> right);
		else if (x -> right == nil) y = x -> left , transplant(x , x -> left);
		else
		{
			Node *z = findmin(x -> right);col = z -> color , y = z -> right;
			if (z -> parent == x) z -> right -> parent = z;//assure that nil -> parent = z
			else
			{
				transplant(z , z -> right);
				z -> right = x -> right , z -> right -> parent = z;
			}
			transplant(x , z);
			z -> color = x -> color , z -> left = x -> left , z -> left -> parent = z;
		}
		delete x , -- tot;
		if (col == BLACK) erase_fixup(y) , nil -> parent = nil;
		nodebegin = findmin(nil);
	}